

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixer_c.cpp
# Opt level: O0

void Mix_<CTag>(span<const_float,_18446744073709551615UL> InSamples,
               span<std::array<float,_1024UL>,_18446744073709551615UL> OutBuffer,float *CurrentGains
               ,float *TargetGains,size_t Counter,size_t OutPos)

{
  index_type iVar1;
  size_t sVar2;
  iterator paVar3;
  pointer pvVar4;
  float *pfVar5;
  reference pfVar6;
  float *in_R8;
  float *in_R9;
  float fVar7;
  float fVar8;
  double dVar9;
  size_t in_stack_00000008;
  long in_stack_00000010;
  float step_count;
  size_t pos;
  float step;
  float gain;
  float *dst;
  FloatBufferLine *output;
  iterator __end1;
  iterator __begin1;
  span<std::array<float,_1024UL>,_18446744073709551615UL> *__range1;
  size_t min_len;
  float delta;
  float local_88;
  float local_80;
  float local_7c;
  index_type local_78;
  float local_6c;
  iterator local_50;
  float *local_30;
  float *local_28;
  span<std::array<float,_1024UL>,_18446744073709551615UL> local_20;
  span<const_float,_18446744073709551615UL> local_10;
  
  if (in_stack_00000008 == 0) {
    local_88 = 0.0;
  }
  else {
    local_80 = (float)in_stack_00000008;
    local_88 = 1.0 / local_80;
  }
  iVar1 = al::span<const_float,_18446744073709551615UL>::size(&local_10);
  sVar2 = minz(in_stack_00000008,iVar1);
  local_50 = al::span<std::array<float,_1024UL>,_18446744073709551615UL>::begin(&local_20);
  paVar3 = al::span<std::array<float,_1024UL>,_18446744073709551615UL>::end(&local_20);
  local_30 = in_R9;
  local_28 = in_R8;
  for (; local_50 != paVar3; local_50 = local_50 + 1) {
    pvVar4 = std::array<float,_1024UL>::data((array<float,_1024UL> *)0x224c7c);
    pfVar5 = al::assume_aligned<16ul,float>(pvVar4 + in_stack_00000010);
    local_6c = *local_28;
    fVar7 = (*local_30 - local_6c) * local_88;
    local_78 = 0;
    dVar9 = std::fabs((double)(ulong)(uint)fVar7);
    fVar8 = std::numeric_limits<float>::epsilon();
    if (fVar8 < SUB84(dVar9,0)) {
      local_7c = 0.0;
      for (; local_78 != sVar2; local_78 = local_78 + 1) {
        pfVar6 = al::span<const_float,_18446744073709551615UL>::operator[](&local_10,local_78);
        pfVar5[local_78] = *pfVar6 * (fVar7 * local_7c + local_6c) + pfVar5[local_78];
        local_7c = local_7c + 1.0;
      }
      if (local_78 == in_stack_00000008) {
        local_6c = *local_30;
      }
      else {
        local_6c = fVar7 * local_7c + local_6c;
      }
    }
    else {
      local_6c = *local_30;
    }
    *local_28 = local_6c;
    local_28 = local_28 + 1;
    local_30 = local_30 + 1;
    dVar9 = std::fabs((double)(ulong)(uint)local_6c);
    if (1e-05 < SUB84(dVar9,0)) {
      for (; iVar1 = al::span<const_float,_18446744073709551615UL>::size(&local_10),
          local_78 != iVar1; local_78 = local_78 + 1) {
        pfVar6 = al::span<const_float,_18446744073709551615UL>::operator[](&local_10,local_78);
        pfVar5[local_78] = *pfVar6 * local_6c + pfVar5[local_78];
      }
    }
  }
  return;
}

Assistant:

void Mix_<CTag>(const al::span<const float> InSamples, const al::span<FloatBufferLine> OutBuffer,
    float *CurrentGains, const float *TargetGains, const size_t Counter, const size_t OutPos)
{
    const float delta{(Counter > 0) ? 1.0f / static_cast<float>(Counter) : 0.0f};
    const auto min_len = minz(Counter, InSamples.size());
    for(FloatBufferLine &output : OutBuffer)
    {
        float *RESTRICT dst{al::assume_aligned<16>(output.data()+OutPos)};
        float gain{*CurrentGains};
        const float step{(*TargetGains-gain) * delta};

        size_t pos{0};
        if(!(std::fabs(step) > std::numeric_limits<float>::epsilon()))
            gain = *TargetGains;
        else
        {
            float step_count{0.0f};
            for(;pos != min_len;++pos)
            {
                dst[pos] += InSamples[pos] * (gain + step*step_count);
                step_count += 1.0f;
            }
            if(pos == Counter)
                gain = *TargetGains;
            else
                gain += step*step_count;
        }
        *CurrentGains = gain;
        ++CurrentGains;
        ++TargetGains;

        if(!(std::fabs(gain) > GainSilenceThreshold))
            continue;
        for(;pos != InSamples.size();++pos)
            dst[pos] += InSamples[pos] * gain;
    }
}